

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Distribution64(int g_a,int iproc,int64_t *lo,int64_t *hi)

{
  Integer IVar1;
  long lVar2;
  Integer *lo_00;
  Integer *hi_00;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  IVar1 = pnga_ndim((long)g_a);
  lo_00 = local_68;
  hi_00 = local_a8;
  pnga_distribution((long)g_a,(long)iproc,lo_00,hi_00);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      lo[lVar2 + -1] = *lo_00 + -1;
      lo_00 = lo_00 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (0 < IVar1) {
    do {
      hi[IVar1 + -1] = *hi_00 + -1;
      hi_00 = hi_00 + 1;
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  return;
}

Assistant:

void NGA_Distribution64(int g_a, int iproc, int64_t lo[], int64_t hi[])
{
     Integer a=(Integer)g_a;
     Integer p=(Integer)iproc;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     wnga_distribution(a, p, _ga_lo, _ga_hi);
     COPYINDEX_F2C_64(_ga_lo,lo, ndim);
     COPYINDEX_F2C_64(_ga_hi,hi, ndim);
}